

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

Exception *
kj::getDestructionReason
          (Exception *__return_storage_ptr__,void *traceSeparator,Type defaultType,char *defaultFile
          ,int defaultLine,StringPtr defaultDescription)

{
  int line;
  StringPtr value;
  String local_80;
  undefined1 local_65;
  undefined1 local_51;
  Exception *local_50;
  Exception *e;
  Exception *local_40;
  Exception *_e1201;
  InFlightExceptionIterator iter;
  int defaultLine_local;
  char *defaultFile_local;
  Type defaultType_local;
  void *traceSeparator_local;
  Exception *copy;
  
  iter.ptr._4_4_ = defaultLine;
  InFlightExceptionIterator::InFlightExceptionIterator((InFlightExceptionIterator *)&_e1201);
  InFlightExceptionIterator::next((InFlightExceptionIterator *)&e);
  local_50 = _::readMaybe<kj::Exception_const>((Maybe<const_kj::Exception_&> *)&e);
  line = iter.ptr._4_4_;
  local_40 = local_50;
  if (local_50 == (Exception *)0x0) {
    local_65 = 0;
    value.content.size_._0_4_ = iter.ptr._4_4_;
    value.content.ptr = (char *)defaultDescription.content.size_;
    value.content.size_._4_4_ = 0;
    heapString(&local_80,(kj *)defaultDescription.content.ptr,value);
    Exception::Exception(__return_storage_ptr__,defaultType,defaultFile,line,&local_80);
    String::~String(&local_80);
    Exception::extendTrace(__return_storage_ptr__,2,0x10);
    Exception::addTrace(__return_storage_ptr__,traceSeparator);
  }
  else {
    local_51 = 0;
    cp<kj::Exception>(__return_storage_ptr__,local_50);
    Exception::truncateCommonTrace(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Exception getDestructionReason(void* traceSeparator, kj::Exception::Type defaultType,
    const char* defaultFile, int defaultLine, kj::StringPtr defaultDescription) {
  InFlightExceptionIterator iter;
  KJ_IF_SOME(e, iter.next()) {
    auto copy = kj::cp(e);
    copy.truncateCommonTrace();
    return copy;
  } else {
    // Darn, use a generic exception.
    kj::Exception exception(defaultType, defaultFile, defaultLine,
        kj::heapString(defaultDescription));

    // Let's give some context on where the PromiseFulfiller was destroyed.
    exception.extendTrace(2, 16);

    // Add a separator that hopefully makes this understandable...
    exception.addTrace(traceSeparator);

    return exception;
  }